

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * cfd::core::Privkey::FromWif
                    (Privkey *__return_storage_ptr__,string *wif,NetType net_type,bool is_compressed
                    )

{
  byte bVar1;
  int prefix_00;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  uchar *puVar6;
  size_type sVar7;
  undefined8 uVar8;
  byte *pbVar9;
  reference __src;
  string *message;
  vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>
  *in_stack_fffffffffffffc58;
  KeyFormatData *in_stack_fffffffffffffc60;
  allocator *paVar10;
  string *in_stack_fffffffffffffc70;
  size_type in_stack_fffffffffffffc78;
  CfdError CVar11;
  CfdException *in_stack_fffffffffffffc80;
  ByteData local_2d0;
  undefined1 local_2b3;
  undefined1 local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  ByteData local_290;
  string local_278;
  CfdSourceLocation local_258;
  undefined1 local_23a;
  allocator local_239;
  string local_238 [32];
  CfdSourceLocation local_218;
  int local_1fc;
  uint32_t local_1f8;
  int ret_1;
  uint32_t flags;
  uint32_t prefix_1;
  KeyFormatData format_data;
  string local_170 [32];
  KeyFormatData *local_150;
  KeyFormatData *format;
  KeyFormatData *local_140;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *__range3;
  bool has_prefix;
  uint32_t prefix;
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  int local_88 [2];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t uncompressed;
  size_t written;
  NetType local_50;
  bool is_temp_compressed;
  NetType temp_net_type;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey;
  bool is_compressed_local;
  NetType net_type_local;
  string *wif_local;
  Privkey *key;
  
  privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = is_compressed;
  privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = net_type;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4721de);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc78,(allocator_type *)in_stack_fffffffffffffc70);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4721fe);
  local_50 = privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
  written._7_1_ =
       privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1;
  if (privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == kCustomChain) {
    uncompressed = 0;
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x472236);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc78,(allocator_type *)in_stack_fffffffffffffc70);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x472256);
    pcVar5 = (char *)::std::__cxx11::string::data();
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x472276);
    sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    local_88[0] = wally_base58_to_bytes(pcVar5,1,puVar6,sVar7,&uncompressed);
    CVar11 = (CfdError)(in_stack_fffffffffffffc78 >> 0x20);
    if (local_88[0] != 0) {
      local_a0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                   ,0x2f);
      local_a0.filename = local_a0.filename + 1;
      local_a0.line = 0x2c1;
      local_a0.funcname = "FromWif";
      logger::warn<int&,std::__cxx11::string_const&>
                (&local_a0,"wally_base58_to_bytes error. ret={} wif={}.",local_88,wif);
      local_c2 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"Error decode base58 WIF.",&local_c1);
      CfdException::CfdException(in_stack_fffffffffffffc80,CVar11,in_stack_fffffffffffffc70);
      local_c2 = 0;
      __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pcVar5 = (char *)::std::__cxx11::string::data();
    local_88[0] = wally_wif_is_uncompressed
                            (pcVar5,(size_t *)
                                    &buf.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CVar11 = (CfdError)(in_stack_fffffffffffffc78 >> 0x20);
    if (local_88[0] != 0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x2c9;
      local_e0.funcname = "FromWif";
      logger::warn<int&,std::__cxx11::string_const&>
                (&local_e0,"wally_wif_is_uncompressed error. ret={} wif={}.",local_88,wif);
      uVar8 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&prefix,"Error WIF is uncompressed.",(allocator *)&has_prefix);
      CfdException::CfdException(in_stack_fffffffffffffc80,CVar11,in_stack_fffffffffffffc70);
      __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pbVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0);
    bVar1 = *pbVar9;
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4725af);
    __src = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,1);
    sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    memcpy(puVar6,__src,sVar7);
    bVar3 = false;
    GetKeyFormatList();
    __end3 = ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::
             begin(in_stack_fffffffffffffc58);
    local_140 = (KeyFormatData *)
                ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::
                end(in_stack_fffffffffffffc58);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
                          *)in_stack_fffffffffffffc60,
                         (__normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
                          *)in_stack_fffffffffffffc58);
      CVar11 = (CfdError)(in_stack_fffffffffffffc78 >> 0x20);
      if (!bVar2) break;
      local_150 = __gnu_cxx::
                  __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
                  ::operator*(&__end3);
      uVar4 = KeyFormatData::GetWifPrefix(local_150);
      CVar11 = (CfdError)(in_stack_fffffffffffffc78 >> 0x20);
      if (uVar4 == bVar1) {
        local_50 = KeyFormatData::GetNetType(local_150);
        bVar3 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
      ::operator++(&__end3);
    }
    format._4_4_ = 2;
    ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
              ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
               in_stack_fffffffffffffc70);
    if (!bVar3) {
      format_data.bip84_.privkey_version._2_1_ = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_170,"Failed to parse WIF. unsupported WIF prefix.",
                 (allocator *)((long)&format_data.bip84_.privkey_version + 3));
      CfdException::CfdException(in_stack_fffffffffffffc80,CVar11,in_stack_fffffffffffffc70);
      format_data.bip84_.privkey_version._2_1_ = 0;
      __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    written._7_1_ =
         -(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == (pointer)0x0) & 1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70);
  }
  else {
    GetKeyFormatData((KeyFormatData *)&flags,
                     privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    CVar11 = (CfdError)(in_stack_fffffffffffffc78 >> 0x20);
    ret_1 = KeyFormatData::GetWifPrefix((KeyFormatData *)&flags);
    local_1f8 = (byte)~privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1;
    in_stack_fffffffffffffc80 = (CfdException *)::std::__cxx11::string::data();
    prefix_00 = ret_1;
    uVar4 = local_1f8;
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x472832);
    local_1fc = wally_wif_to_bytes((char *)in_stack_fffffffffffffc80,prefix_00,uVar4,puVar6,0x20);
    if (local_1fc != 0) {
      local_218.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                   ,0x2f);
      local_218.filename = local_218.filename + 1;
      local_218.line = 0x2eb;
      local_218.funcname = "FromWif";
      logger::warn<int&,std::__cxx11::string_const&>
                (&local_218,"wally_wif_to_bytes error. ret={} wif={}.",&local_1fc,wif);
      local_23a = 1;
      message = (string *)__cxa_allocate_exception(0x30);
      paVar10 = &local_239;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_238,"Error WIF to Private key.",paVar10);
      CfdException::CfdException
                (in_stack_fffffffffffffc80,(CfdError)((ulong)paVar10 >> 0x20),message);
      local_23a = 0;
      __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_50 = privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
    written._7_1_ =
         privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_ & 1;
    KeyFormatData::~KeyFormatData(in_stack_fffffffffffffc60);
  }
  bVar3 = IsValid((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  if (!bVar3) {
    local_258.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                 ,0x2f);
    local_258.filename = local_258.filename + 1;
    local_258.line = 0x2f6;
    local_258.funcname = "FromWif";
    ByteData::ByteData(&local_290,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38)
    ;
    ByteData::GetHex_abi_cxx11_(&local_278,&local_290);
    logger::warn<std::__cxx11::string>(&local_258,"Invalid Privkey data. data={}",&local_278);
    ::std::__cxx11::string::~string((string *)&local_278);
    ByteData::~ByteData((ByteData *)0x472a94);
    local_2b2 = 1;
    uVar8 = __cxa_allocate_exception(0x30);
    paVar10 = &local_2b1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_2b0,"Invalid Privkey data",paVar10);
    CfdException::CfdException(in_stack_fffffffffffffc80,CVar11,in_stack_fffffffffffffc70);
    local_2b2 = 0;
    __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_2b3 = 0;
  ByteData::ByteData(&local_2d0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  Privkey(__return_storage_ptr__,&local_2d0,kMainnet,true);
  ByteData::~ByteData((ByteData *)0x472be1);
  SetPubkeyCompressed(__return_storage_ptr__,(bool)(written._7_1_ & 1));
  SetNetType(__return_storage_ptr__,local_50);
  format._4_4_ = 1;
  local_2b3 = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::FromWif(
    const std::string &wif, NetType net_type, bool is_compressed) {
  std::vector<uint8_t> privkey(kPrivkeySize);
  NetType temp_net_type = net_type;
  bool is_temp_compressed = is_compressed;
  if (net_type == NetType::kCustomChain) {
    // auto analyze
    size_t written = 0;
    size_t uncompressed = 0;
    std::vector<uint8_t> buf(2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN);
    int ret = wally_base58_to_bytes(
        wif.data(), BASE58_FLAG_CHECKSUM, buf.data(), buf.size(), &written);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={} wif={}.", ret,
          wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error decode base58 WIF.");
    }
    ret = wally_wif_is_uncompressed(wif.data(), &uncompressed);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_wif_is_uncompressed error. ret={} wif={}.",
          ret, wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error WIF is uncompressed.");
    }

    uint32_t prefix = buf[0];
    memcpy(privkey.data(), &buf[1], privkey.size());

    bool has_prefix = false;
    for (const auto &format : GetKeyFormatList()) {
      if (format.GetWifPrefix() == prefix) {
        temp_net_type = format.GetNetType();
        has_prefix = true;
        break;
      }
    }
    if (!has_prefix) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parse WIF. unsupported WIF prefix.");
    }
    is_temp_compressed = (uncompressed == 0) ? true : false;
  } else {
    auto format_data = GetKeyFormatData(net_type);
    uint32_t prefix = format_data.GetWifPrefix();
    uint32_t flags =
        (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                       : WALLY_WIF_FLAG_UNCOMPRESSED);

    int ret = wally_wif_to_bytes(
        wif.data(), prefix, flags, privkey.data(), kPrivkeySize);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_wif_to_bytes error. ret={} wif={}.", ret,
          wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error WIF to Private key.");
    }
    temp_net_type = net_type;
    is_temp_compressed = is_compressed;
  }

  if (!IsValid(privkey)) {
    warn(
        CFD_LOG_SOURCE, "Invalid Privkey data. data={}",
        ByteData(privkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data");
  }
  Privkey key = Privkey(ByteData(privkey));
  key.SetPubkeyCompressed(is_temp_compressed);
  key.SetNetType(temp_net_type);
  return key;
}